

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O2

Expr exec_eval(pExecutor exec,pContext context,Expr expr)

{
  _Bool _Var1;
  int iVar2;
  Expr *__ptr;
  anon_union_8_8_707b72ea_for_Expr_1 key;
  ValueType VVar3;
  anon_union_8_8_707b72ea_for_Expr_1 aVar4;
  Expr EVar5;
  Expr EVar6;
  Expr expr_00;
  Expr expr_01;
  int len;
  Expr local_38;
  
  key = expr.field_1;
  VVar3 = expr.type;
  if (VVar3 == VT_PAIR) {
    expr_01.field_1.val_atom = key.val_atom;
    expr_01._0_8_ = 2;
    __ptr = get_list(exec,expr_01,&len);
    EVar5._4_4_ = 0;
    EVar5.type = __ptr->type;
    EVar5.field_1.val_atom = (__ptr->field_1).val_atom;
    EVar5 = get_function(exec,context,EVar5);
    expr_00._4_4_ = 0;
    expr_00.type = EVar5.type;
    expr_00.field_1.val_atom = EVar5.field_1.val_atom;
    _Var1 = is_none(expr_00);
    if (_Var1) {
      puts("eval: list head not a function or registered macro");
      goto LAB_00107423;
    }
    EVar5 = exec_function(exec,context,EVar5.field_1.val_func,__ptr + 1,len + -1);
    free(__ptr);
    aVar4.val_atom = EVar5.field_1.val_atom;
    VVar3 = EVar5.type;
  }
  else {
    aVar4.val_atom = key.val_atom;
    if ((VVar3 == VT_ATOM) &&
       (iVar2 = context_get(context,key.val_atom,&local_38), aVar4 = local_38.field_1,
       VVar3 = local_38.type, iVar2 == -1)) {
      printf("eval: atom \"%s\" not binded\n",exec->atoms[key.val_atom]);
LAB_00107423:
      exit(1);
    }
  }
  EVar6._4_4_ = 0;
  EVar6.type = VVar3;
  EVar6.field_1.val_atom = aVar4.val_atom;
  return EVar6;
}

Assistant:

Expr exec_eval(pExecutor exec, pContext context, Expr expr)
{
    if (expr.type == VT_ATOM)
    {
        Expr value;
        if (context_get(context, expr.val_atom, &value) == MAP_FAILED)
        {
            logf("eval: atom \"%s\" not binded", exec->atoms[expr.val_atom]);
            exit(1);
        }
        return value;
    }
    else if (expr.type != VT_PAIR)
    {
        return expr;
    }

    int len;
    Expr *list = get_list(exec, expr, &len);

    Expr func = get_function(exec, context, list[0]);
    if (is_none(func))
    {
        log("eval: list head not a function or registered macro");
        // TODO: print debug information
        exit(1);
    }
    Expr result = exec_function(exec, context, func.val_func, list + 1, len - 1);
    free(list);
    return result;
}